

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsFile.cpp
# Opt level: O3

int AdsFile::Find(AdsDevice *route,string *basePath,size_t maxdepth,ostream *os)

{
  pointer pcVar1;
  bool bVar2;
  _List_node_base *p_Var3;
  ostream *poVar4;
  size_t sVar5;
  long *plVar6;
  _List_node_base *p_Var7;
  int iVar8;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  list<Path,_std::allocator<Path>_> pendingDirs;
  TcFileFindData parent;
  char *local_210;
  size_t local_208;
  char local_200 [16];
  _List_node_base *local_1f0;
  _List_node_base *local_1e8;
  undefined1 local_1e0 [16];
  _List_node_base *p_Stack_1d0;
  _List_base<Path,_std::allocator<Path>_> local_1c8;
  _List_node_base *local_1b0;
  ostream *local_1a8;
  undefined1 *local_1a0;
  ulong local_198;
  undefined1 local_190 [16];
  _List_node_base *local_180;
  undefined8 local_178;
  undefined1 *local_170;
  uint64_t local_168;
  undefined1 local_160 [24];
  char local_148 [280];
  
  local_178 = (_List_node_base *)0x0;
  pcVar1 = (basePath->_M_dataplus)._M_p;
  local_1a8 = os;
  local_180 = (_List_node_base *)maxdepth;
  local_170 = local_160;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,pcVar1,pcVar1 + basePath->_M_string_length);
  local_1c8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_1c8;
  local_1c8._M_impl._M_node._M_size = 0;
  local_1c8._M_impl._M_node.super__List_node_base._M_prev =
       local_1c8._M_impl._M_node.super__List_node_base._M_next;
  p_Var3 = (_List_node_base *)operator_new(0x38);
  p_Var3[1]._M_next = local_178;
  p_Var3[1]._M_prev = (_List_node_base *)&p_Var3[2]._M_prev;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&p_Var3[1]._M_prev,local_170,local_170 + local_168);
  std::__detail::_List_node_base::_M_hook(p_Var3);
  local_1c8._M_impl._M_node._M_size = local_1c8._M_impl._M_node._M_size + 1;
  if (local_170 != local_160) {
    operator_delete(local_170);
  }
  if (local_1c8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_1c8) {
    p_Var3 = (_List_node_base *)(local_1e0 + 8);
    do {
      local_210 = local_200;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,
                 local_1c8._M_impl._M_node.super__List_node_base._M_next[1]._M_prev,
                 (long)&(local_1c8._M_impl._M_node.super__List_node_base._M_next[1]._M_prev)->
                        _M_next +
                 (long)local_1c8._M_impl._M_node.super__List_node_base._M_next[2]._M_next);
      p_Var7 = local_1c8._M_impl._M_node.super__List_node_base._M_next;
      local_1b0 = local_1c8._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
      local_1c8._M_impl._M_node._M_size = local_1c8._M_impl._M_node._M_size - 1;
      std::__detail::_List_node_base::_M_unhook();
      if (p_Var7[1]._M_prev != (_List_node_base *)&p_Var7[2]._M_prev) {
        operator_delete(p_Var7[1]._M_prev);
      }
      operator_delete(p_Var7);
      local_178 = (_List_node_base *)CONCAT44(local_178._4_4_,1);
      bVar2 = FindNext(route,(TcFileFindData *)&local_178,local_208,local_210);
      if (bVar2) {
        if (local_210 != local_200) {
          operator_delete(local_210);
        }
        iVar8 = 0x70c;
        goto LAB_00119197;
      }
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_210,local_208);
      local_1f0 = (_List_node_base *)CONCAT71(local_1f0._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_1f0,1);
      if ((local_1b0 < local_180 & local_178._4_1_ >> 4) == 1) {
        local_1f0 = (_List_node_base *)local_1e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f0,local_210,local_210 + local_208);
        std::__cxx11::string::append((char *)&local_1f0);
        local_178 = (_List_node_base *)CONCAT44(local_178._4_4_,1);
        bVar2 = FindNext(route,(TcFileFindData *)&local_178,(size_t)local_1e8,(char *)local_1f0);
        if (local_1f0 != (_List_node_base *)local_1e0) {
          operator_delete(local_1f0);
        }
        local_1b0 = (_List_node_base *)((long)&local_1b0->_M_next + 1);
        while (bVar2 == false) {
          if (((ulong)local_178 & 0x1000000000) == 0) {
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_1a8,local_210,local_208);
            local_1f0._0_1_ = (string)0x2f;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_1f0,1)
            ;
            sVar5 = strlen(local_148);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_148,sVar5);
            local_1f0 = (_List_node_base *)CONCAT71(local_1f0._1_7_,10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_1f0,1);
          }
          else {
            local_1f0 = local_1b0;
            local_1a0 = local_190;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1a0,local_210,local_210 + local_208);
            std::__cxx11::string::_M_replace_aux((ulong)&local_1a0,local_198,0,'\x01');
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_1a0);
            p_Var7 = (_List_node_base *)(plVar6 + 2);
            if ((_List_node_base *)*plVar6 == p_Var7) {
              local_1e0._8_8_ = p_Var7->_M_next;
              p_Stack_1d0 = (_List_node_base *)plVar6[3];
              local_1e8 = p_Var3;
            }
            else {
              local_1e0._8_8_ = p_Var7->_M_next;
              local_1e8 = (_List_node_base *)*plVar6;
            }
            local_1e0._0_8_ = plVar6[1];
            *plVar6 = (long)p_Var7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            p_Var7 = (_List_node_base *)operator_new(0x38);
            p_Var7[1]._M_next = local_1f0;
            p_Var7[1]._M_prev = (_List_node_base *)&p_Var7[2]._M_prev;
            if (local_1e8 == p_Var3) {
              p_Var7[2]._M_prev = (_List_node_base *)local_1e0._8_8_;
              p_Var7[3]._M_next = p_Stack_1d0;
            }
            else {
              p_Var7[1]._M_prev = local_1e8;
              p_Var7[2]._M_prev = (_List_node_base *)local_1e0._8_8_;
            }
            p_Var7[2]._M_next = (_List_node_base *)local_1e0._0_8_;
            local_1e0._0_8_ = (_List_node_base *)0x0;
            local_1e0._8_8_ = local_1e0._8_8_ & 0xffffffffffffff00;
            local_1e8 = p_Var3;
            std::__detail::_List_node_base::_M_hook(p_Var7);
            local_1c8._M_impl._M_node._M_size = local_1c8._M_impl._M_node._M_size + 1;
            if (local_1e8 != p_Var3) {
              operator_delete(local_1e8);
            }
            if (local_1a0 != local_190) {
              operator_delete(local_1a0);
            }
          }
          bVar2 = FindNext(route,(TcFileFindData *)&local_178,0,(char *)0x0);
        }
      }
      if (local_210 != local_200) {
        operator_delete(local_210);
      }
    } while (local_1c8._M_impl._M_node.super__List_node_base._M_next !=
             (_List_node_base *)&local_1c8);
  }
  iVar8 = 0;
LAB_00119197:
  std::__cxx11::_List_base<Path,_std::allocator<Path>_>::~_List_base(&local_1c8);
  return iVar8;
}

Assistant:

int AdsFile::Find(const AdsDevice& route, const std::string& basePath, const size_t maxdepth, std::ostream& os)
{
    struct Path {
        size_t depth;
        std::string path;
    };
    std::list<struct Path> pendingDirs{{ 0, basePath} };
    while (!pendingDirs.empty()) {
        auto path = pendingDirs.front().path;
        auto depth = pendingDirs.front().depth;
        pendingDirs.pop_front();

        TcFileFindData parent;
        if (FindFirst(route, parent, path)) {
            return 1804;
        }

        // Path exists print it and prepare traversing
        os << path << '\n';

        if (parent.isDirectory() && (depth < maxdepth)) {
            // Finding files in a directory is a bit weird. We get only one entry per call and for
            // every call we pass the last found item to get the next. The first item is special.
            // To get the children of a directory we have to append '/*'to the path of the directory.
            for (auto last = FindFirst(route, parent, path + "/*"); !last; last = FindNext(route, parent)) {
                if (parent.isDirectory()) {
                    pendingDirs.push_back({depth + 1, path + '/' + parent.cFileName});
                } else {
                    os << path << '/' << parent.cFileName << '\n';
                }
            }
        }
    }
    return 0;
}